

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Bot.cpp
# Opt level: O2

string * __thiscall
IRC_Bot::getTriggers_abi_cxx11_
          (string *__return_storage_ptr__,IRC_Bot *this,
          vector<IRCCommand_*,_std::allocator<IRCCommand_*>_> *commands)

{
  ulong *puVar1;
  IRCCommand **command;
  ulong *puVar2;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  puVar1 = *(ulong **)&this->field_0x8;
  for (puVar2 = *(ulong **)this; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    bVar3 = (basic_string_view<char,_std::char_traits<char>_>)Jupiter::Command::getTrigger(*puVar2);
    local_38 = bVar3;
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)__return_storage_ptr__,&local_38);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__return_storage_ptr__,' ');
  }
  return __return_storage_ptr__;
}

Assistant:

std::string IRC_Bot::getTriggers(std::vector<IRCCommand*> &commands) {
	std::string result;
	for (const auto& command : commands) {
		result += command->getTrigger();
		result += ' ';
	}

	return result;
}